

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::PoolingParameter::set_engine(PoolingParameter *this,PoolingParameter_Engine value)

{
  byte *pbVar1;
  
  if (value < (PoolingParameter_Engine_CUDNN|PoolingParameter_Engine_CAFFE)) {
    pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
    *pbVar1 = *pbVar1 | 2;
    this->engine_ = value;
    return;
  }
  __assert_fail("::caffe::PoolingParameter_Engine_IsValid(value)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/include/caffe/proto/caffe.pb.h"
                ,0x51d1,"void caffe::PoolingParameter::set_engine(::caffe::PoolingParameter_Engine)"
               );
}

Assistant:

bool PoolingParameter_Engine_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
    case 2:
      return true;
    default:
      return false;
  }
}